

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void flip_16_masked_pixels
               (tgestate_t *state,uint8_t *pD,uint8_t *pE,uint8_t *pDdash,uint8_t *pEdash)

{
  uint8_t uVar1;
  uint8_t E;
  uint8_t D;
  uint8_t *HL;
  uint8_t *pEdash_local;
  uint8_t *pDdash_local;
  uint8_t *pE_local;
  uint8_t *pD_local;
  tgestate_t *state_local;
  
  uVar1 = state->reversed[*pE];
  *pE = state->reversed[*pD];
  *pD = uVar1;
  uVar1 = state->reversed[*pEdash];
  *pEdash = state->reversed[*pDdash];
  *pDdash = uVar1;
  return;
}

Assistant:

void flip_16_masked_pixels(tgestate_t *state,
                           uint8_t    *pD,
                           uint8_t    *pE,
                           uint8_t    *pDdash,
                           uint8_t    *pEdash)
{
  const uint8_t *HL;
  uint8_t        D, E;

  assert(state  != NULL);
  assert(pD     != NULL);
  assert(pE     != NULL);
  assert(pDdash != NULL);
  assert(pEdash != NULL);

  HL = &state->reversed[0];

  D = HL[*pE];
  E = HL[*pD];

  *pE = E;
  *pD = D;

  D = HL[*pEdash];
  E = HL[*pDdash];

  *pEdash = E;
  *pDdash = D;
}